

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDForceModifier.cpp
# Opt level: O2

void __thiscall OpenMD::LDForceModifier::modifyForces(LDForceModifier *this)

{
  MomentData *pMVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Molecule *this_00;
  Globals *pGVar5;
  StuntDouble *this_01;
  ulong uVar6;
  Vector<double,_3U> *v1;
  Vector<double,_3U> *v1_00;
  RectMatrix<double,_3U,_3U> *m;
  uint index;
  ulong uVar7;
  int k;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  Vector3d omegaBody;
  pointer local_3e8;
  Vector<double,_3U> local_3e0;
  Molecule *local_3c8;
  ulong local_3c0;
  RectMatrix<double,_3U,_3U> local_3b8;
  double local_370;
  Vector3d frictionTorqueBody;
  Vector3d frictionForceLab;
  Vector3d vel;
  Vector3d rcrLab;
  MoleculeIterator i;
  Vector3d angMomStep;
  Vector3d randomTorqueLab;
  Vector3d randomForceLab;
  Vector3d frc;
  Vector<double,_3U> local_2a0;
  Vector<double,_3U> local_288;
  Vector<double,_3U> local_270;
  Vector3d vcdBody;
  Vector3d randomForceBody;
  Vector3d Tb;
  Vector3d frictionTorqueLab;
  Vector3d oldFTB;
  Vector3d oldFFL;
  Vector3d frictionForceBody;
  Vector3d vcdLab;
  Vector3d velStep;
  Vector3d randomTorqueBody;
  Mat3x3d Atrans;
  Vector3d omegaLab;
  Vector3d angMom;
  Vector3d ji;
  Mat3x3d A;
  Vector3d pos;
  Vector3d molPos;
  
  i._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&pos.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&frc.super_Vector<double,_3U>);
  SquareMatrix<double,_3>::SquareMatrix(&A.super_SquareMatrix<double,_3>);
  SquareMatrix<double,_3>::SquareMatrix(&Atrans.super_SquareMatrix<double,_3>);
  Vector<double,_3U>::Vector(&Tb.super_Vector<double,_3U>);
  Vector<double,_3U>::Vector(&ji.super_Vector<double,_3U>);
  this_00 = SimInfo::beginMolecule((this->super_ForceModifier).info_,&i);
  uVar6 = 0;
  index = 0;
  do {
    if (this_00 == (Molecule *)0x0) {
      ((this->super_ForceModifier).info_)->fdf_local = (int)uVar6;
      pGVar5 = this->simParams_;
      if ((pGVar5->ConserveLinearMomentum).super_ParameterBase.field_0x2b == '\x01') {
        Velocitizer::removeComDrift
                  ((this->veloMunge_)._M_t.
                   super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>
                   .super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl);
        pGVar5 = this->simParams_;
      }
      if (((pGVar5->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\0') &&
         ((pGVar5->ConserveAngularMomentum).super_ParameterBase.field_0x2b == '\x01')) {
        Velocitizer::removeAngularDrift
                  ((this->veloMunge_)._M_t.
                   super___uniq_ptr_impl<OpenMD::Velocitizer,_std::default_delete<OpenMD::Velocitizer>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_OpenMD::Velocitizer_*,_std::default_delete<OpenMD::Velocitizer>_>
                   .super__Head_base<0UL,_OpenMD::Velocitizer_*,_false>._M_head_impl);
      }
      return;
    }
    if (this->sphericalBoundaryConditions_ == true) {
      Molecule::getCom(&molPos,this_00);
      dVar8 = Vector<double,_3U>::length((Vector<double,_3U> *)&molPos);
      bVar2 = this->frozenBufferRadius_ < dVar8;
      bVar3 = dVar8 <= this->frozenBufferRadius_ && this->langevinBufferRadius_ < dVar8;
    }
    else {
      bVar3 = true;
      bVar2 = false;
    }
    local_3e8 = (this_00->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    local_3c8 = this_00;
    if (local_3e8 !=
        (this_00->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00204a79;
    this_01 = (StuntDouble *)0x0;
    while (this_01 != (StuntDouble *)0x0) {
      if (bVar2) {
        iVar4 = StuntDouble::freeze(this_01);
        uVar6 = (ulong)(uint)((int)uVar6 + iVar4);
      }
      if (bVar3) {
        dVar8 = this_01->mass_;
        local_3c0 = uVar6;
        if (this_01->objType_ - otDAtom < 2) {
          StuntDouble::getA((RotMat3x3d *)&molPos,this_01);
          RectMatrix<double,_3U,_3U>::operator=
                    ((RectMatrix<double,_3U,_3U> *)&A,(RectMatrix<double,_3U,_3U> *)&molPos);
          SquareMatrix3<double>::transpose
                    ((SquareMatrix3<double> *)&molPos,(SquareMatrix3<double> *)&A);
          RectMatrix<double,_3U,_3U>::operator=
                    ((RectMatrix<double,_3U,_3U> *)&Atrans,(RectMatrix<double,_3U,_3U> *)&molPos);
          operator*((Vector<double,_3U> *)&molPos,(RectMatrix<double,_3U,_3U> *)&Atrans,
                    (Vector<double,_3U> *)
                    (this->moments_).
                    super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[index]);
          Vector<double,_3U>::Vector(&rcrLab.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos)
          ;
          Vector<double,_3U>::Vector(&randomForceBody.super_Vector<double,_3U>);
          Vector<double,_3U>::Vector(&randomTorqueBody.super_Vector<double,_3U>);
          genRandomForceAndTorque
                    (this,(Vector3d *)&randomForceBody.super_Vector<double,_3U>,
                     (Vector3d *)&randomTorqueBody.super_Vector<double,_3U>,index);
          operator*((Vector<double,_3U> *)&molPos,(RectMatrix<double,_3U,_3U> *)&Atrans,
                    &randomForceBody.super_Vector<double,_3U>);
          Vector<double,_3U>::Vector
                    (&randomForceLab.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos);
          operator*((Vector<double,_3U> *)&molPos,(RectMatrix<double,_3U,_3U> *)&Atrans,
                    &randomTorqueBody.super_Vector<double,_3U>);
          Vector<double,_3U>::Vector
                    (&randomTorqueLab.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos);
          StuntDouble::addFrc(this_01,&randomForceLab);
          cross<double>(&omegaBody,&rcrLab,&randomForceLab);
          OpenMD::operator+((Vector<double,_3U> *)&local_3b8,
                            &randomTorqueLab.super_Vector<double,_3U>,
                            &omegaBody.super_Vector<double,_3U>);
          Vector<double,_3U>::Vector((Vector<double,_3U> *)&molPos,(Vector<double,_3U> *)&local_3b8)
          ;
          StuntDouble::addTrq(this_01,&molPos);
          Vector<double,_3U>::Vector(&omegaBody.super_Vector<double,_3U>);
          StuntDouble::getVel(&vel,this_01);
          StuntDouble::getJ((Vector3d *)&angMom.super_Vector<double,_3U>,this_01);
          StuntDouble::getFrc(&molPos,this_01);
          Vector<double,_3U>::operator=(&frc.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos)
          ;
          operator*((Vector<double,_3U> *)&local_3b8,(this->dt2_ / dVar8) * 0.0004184,
                    &frc.super_Vector<double,_3U>);
          OpenMD::operator+((Vector<double,_3U> *)&molPos,&vel.super_Vector<double,_3U>,
                            (Vector<double,_3U> *)&local_3b8);
          Vector<double,_3U>::Vector
                    (&velStep.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos);
          StuntDouble::getTrq((Vector3d *)&local_3b8,this_01);
          StuntDouble::lab2Body(&molPos,this_01,(Vector3d *)&local_3b8);
          Vector<double,_3U>::operator=(&Tb.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos);
          operator*((Vector<double,_3U> *)&local_3b8,this->dt2_ * 0.0004184,
                    &Tb.super_Vector<double,_3U>);
          OpenMD::operator+((Vector<double,_3U> *)&molPos,&angMom.super_Vector<double,_3U>,
                            (Vector<double,_3U> *)&local_3b8);
          Vector<double,_3U>::Vector
                    (&angMomStep.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos);
          Vector<double,_3U>::Vector(&omegaLab.super_Vector<double,_3U>);
          Vector<double,_3U>::Vector(&vcdLab.super_Vector<double,_3U>);
          Vector<double,_3U>::Vector(&vcdBody.super_Vector<double,_3U>);
          Vector<double,_3U>::Vector(&frictionForceBody.super_Vector<double,_3U>);
          local_3b8.data_[0][0] = 0.0;
          Vector<double,_3U>::Vector((Vector<double,_3U> *)&molPos,(double *)&local_3b8);
          Vector<double,_3U>::Vector
                    (&frictionForceLab.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos);
          Vector<double,_3U>::Vector(&oldFFL.super_Vector<double,_3U>);
          local_3b8.data_[0][0] = 0.0;
          Vector<double,_3U>::Vector((Vector<double,_3U> *)&molPos,(double *)&local_3b8);
          Vector<double,_3U>::Vector
                    (&frictionTorqueBody.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos);
          Vector<double,_3U>::Vector(&oldFTB.super_Vector<double,_3U>);
          Vector<double,_3U>::Vector(&frictionTorqueLab.super_Vector<double,_3U>);
          for (iVar4 = 0; iVar4 < this->maxIterNum_; iVar4 = iVar4 + 1) {
            if (this_01->linear_ == true) {
              uVar7 = (long)(this_01->linearAxis_ + 1) % 3 & 0xffffffff;
              uVar6 = (long)(this_01->linearAxis_ + 2) % 3 & 0xffffffff;
              pMVar1 = (this->moments_).
                       super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[index];
              omegaBody.super_Vector<double,_3U>.data_[uVar7] =
                   angMomStep.super_Vector<double,_3U>.data_[uVar7] /
                   *(double *)
                    ((long)&(pMVar1->Icr).super_SquareMatrix<double,_3>.
                            super_RectMatrix<double,_3U,_3U> + uVar7 * 0x20);
              omegaBody.super_Vector<double,_3U>.data_[uVar6] =
                   angMomStep.super_Vector<double,_3U>.data_[uVar6] /
                   *(double *)
                    ((long)&(pMVar1->Icr).super_SquareMatrix<double,_3>.
                            super_RectMatrix<double,_3U,_3U> + uVar6 * 0x20);
            }
            else {
              operator*((Vector<double,_3U> *)&molPos,
                        (RectMatrix<double,_3U,_3U> *)
                        &(this->moments_).
                         super__Vector_base<OpenMD::MomentData_*,_std::allocator<OpenMD::MomentData_*>_>
                         ._M_impl.super__Vector_impl_data._M_start[index]->IcrInv,
                        &angMomStep.super_Vector<double,_3U>);
              Vector3<double>::operator=(&omegaBody,(Vector<double,_3U> *)&molPos);
            }
            operator*((Vector<double,_3U> *)&molPos,(RectMatrix<double,_3U,_3U> *)&Atrans,
                      &omegaBody.super_Vector<double,_3U>);
            Vector3<double>::operator=(&omegaLab,(Vector<double,_3U> *)&molPos);
            cross<double>((Vector3<double> *)&local_3b8,&omegaLab,&rcrLab);
            OpenMD::operator+((Vector<double,_3U> *)&molPos,&velStep.super_Vector<double,_3U>,
                              (Vector<double,_3U> *)&local_3b8);
            Vector3<double>::operator=(&vcdLab,(Vector<double,_3U> *)&molPos);
            operator*((Vector<double,_3U> *)&molPos,(RectMatrix<double,_3U,_3U> *)&A,
                      &vcdLab.super_Vector<double,_3U>);
            Vector3<double>::operator=(&vcdBody,(Vector<double,_3U> *)&molPos);
            HydroProp::getXitt((Mat3x3d *)&molPos,
                               (this->hydroProps_).
                               super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[index]);
            operator*(&local_288,(RectMatrix<double,_3U,_3U> *)&molPos,
                      &vcdBody.super_Vector<double,_3U>);
            HydroProp::getXirt((Mat3x3d *)&local_3b8,
                               (this->hydroProps_).
                               super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[index]);
            operator*(&local_2a0,&local_3b8,&omegaBody.super_Vector<double,_3U>);
            OpenMD::operator+(&local_270,&local_288,&local_2a0);
            operator-(&local_3e0,(OpenMD *)&local_270,v1);
            Vector3<double>::operator=(&frictionForceBody,&local_3e0);
            Vector<double,_3U>::operator=
                      (&oldFFL.super_Vector<double,_3U>,&frictionForceLab.super_Vector<double,_3U>);
            operator*((Vector<double,_3U> *)&molPos,(RectMatrix<double,_3U,_3U> *)&Atrans,
                      &frictionForceBody.super_Vector<double,_3U>);
            Vector3<double>::operator=(&frictionForceLab,(Vector<double,_3U> *)&molPos);
            Vector<double,_3U>::operator=
                      (&oldFTB.super_Vector<double,_3U>,&frictionTorqueBody.super_Vector<double,_3U>
                      );
            HydroProp::getXitr((Mat3x3d *)&molPos,
                               (this->hydroProps_).
                               super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[index]);
            operator*(&local_288,(RectMatrix<double,_3U,_3U> *)&molPos,
                      &vcdBody.super_Vector<double,_3U>);
            HydroProp::getXirr((Mat3x3d *)&local_3b8,
                               (this->hydroProps_).
                               super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[index]);
            operator*(&local_2a0,&local_3b8,&omegaBody.super_Vector<double,_3U>);
            OpenMD::operator+(&local_270,&local_288,&local_2a0);
            operator-(&local_3e0,(OpenMD *)&local_270,v1_00);
            Vector3<double>::operator=(&frictionTorqueBody,&local_3e0);
            operator*((Vector<double,_3U> *)&molPos,(RectMatrix<double,_3U,_3U> *)&Atrans,
                      &frictionTorqueBody.super_Vector<double,_3U>);
            Vector3<double>::operator=(&frictionTorqueLab,(Vector<double,_3U> *)&molPos);
            dVar9 = this->dt2_;
            OpenMD::operator+(&local_3e0,&frc.super_Vector<double,_3U>,
                              &frictionForceLab.super_Vector<double,_3U>);
            operator*((Vector<double,_3U> *)&local_3b8,(dVar9 / dVar8) * 0.0004184,&local_3e0);
            OpenMD::operator+((Vector<double,_3U> *)&molPos,&vel.super_Vector<double,_3U>,
                              (Vector<double,_3U> *)&local_3b8);
            Vector3<double>::operator=(&velStep,(Vector<double,_3U> *)&molPos);
            dVar9 = this->dt2_;
            OpenMD::operator+(&local_3e0,&Tb.super_Vector<double,_3U>,
                              &frictionTorqueBody.super_Vector<double,_3U>);
            operator*((Vector<double,_3U> *)&local_3b8,dVar9 * 0.0004184,&local_3e0);
            OpenMD::operator+((Vector<double,_3U> *)&molPos,&angMom.super_Vector<double,_3U>,
                              (Vector<double,_3U> *)&local_3b8);
            Vector3<double>::operator=(&angMomStep,(Vector<double,_3U> *)&molPos);
            dVar9 = dot<double,3u>(&frictionForceLab.super_Vector<double,_3U>,
                                   &oldFFL.super_Vector<double,_3U>);
            dVar10 = Vector<double,_3U>::lengthSquare(&frictionForceLab.super_Vector<double,_3U>);
            local_370 = dot<double,3u>(&frictionTorqueBody.super_Vector<double,_3U>,
                                       &oldFTB.super_Vector<double,_3U>);
            dVar11 = Vector<double,_3U>::lengthSquare(&frictionTorqueBody.super_Vector<double,_3U>);
            if ((ABS(1.0 - dVar9 / dVar10) <= this->forceTolerance_) &&
               (ABS(1.0 - local_370 / dVar11) <= this->forceTolerance_)) break;
          }
          StuntDouble::addFrc(this_01,&frictionForceLab);
          cross<double>((Vector3<double> *)&local_3e0,&rcrLab,&frictionForceLab);
          OpenMD::operator+((Vector<double,_3U> *)&local_3b8,
                            &frictionTorqueLab.super_Vector<double,_3U>,&local_3e0);
          Vector<double,_3U>::Vector((Vector<double,_3U> *)&molPos,(Vector<double,_3U> *)&local_3b8)
          ;
          StuntDouble::addTrq(this_01,&molPos);
          uVar6 = local_3c0;
          this_00 = local_3c8;
        }
        else {
          Vector<double,_3U>::Vector(&rcrLab.super_Vector<double,_3U>);
          Vector<double,_3U>::Vector(&randomForceBody.super_Vector<double,_3U>);
          Vector<double,_3U>::Vector(&randomTorqueBody.super_Vector<double,_3U>);
          genRandomForceAndTorque
                    (this,&randomForceBody,(Vector3d *)&randomTorqueBody.super_Vector<double,_3U>,
                     index);
          StuntDouble::getFrc(&molPos,this_01);
          Vector<double,_3U>::operator=
                    (&rcrLab.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos);
          StuntDouble::addFrc(this_01,&randomForceBody);
          StuntDouble::getVel(&randomForceLab,this_01);
          StuntDouble::getFrc(&molPos,this_01);
          Vector<double,_3U>::operator=(&frc.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos)
          ;
          operator*((Vector<double,_3U> *)&local_3b8,(this->dt2_ / dVar8) * 0.0004184,
                    &frc.super_Vector<double,_3U>);
          OpenMD::operator+((Vector<double,_3U> *)&molPos,&randomForceLab.super_Vector<double,_3U>,
                            (Vector<double,_3U> *)&local_3b8);
          Vector<double,_3U>::Vector
                    (&randomTorqueLab.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos);
          local_3b8.data_[0][0] = 0.0;
          Vector<double,_3U>::Vector((Vector<double,_3U> *)&molPos,(double *)&local_3b8);
          Vector<double,_3U>::Vector
                    (&omegaBody.super_Vector<double,_3U>,(Vector<double,_3U> *)&molPos);
          Vector<double,_3U>::Vector(&vel.super_Vector<double,_3U>);
          iVar4 = -1;
          do {
            iVar4 = iVar4 + 1;
            if (this->maxIterNum_ <= iVar4) break;
            Vector<double,_3U>::operator=
                      (&vel.super_Vector<double,_3U>,&omegaBody.super_Vector<double,_3U>);
            HydroProp::getXitt((Mat3x3d *)&local_3b8,
                               (this->hydroProps_).
                               super__Vector_base<OpenMD::HydroProp_*,_std::allocator<OpenMD::HydroProp_*>_>
                               ._M_impl.super__Vector_impl_data._M_start[index]);
            operator-((RectMatrix<double,_3U,_3U> *)&molPos,(OpenMD *)&local_3b8,m);
            operator*(&angMom.super_Vector<double,_3U>,(RectMatrix<double,_3U,_3U> *)&molPos,
                      &randomTorqueLab.super_Vector<double,_3U>);
            Vector3<double>::operator=
                      ((Vector3<double> *)&omegaBody.super_Vector<double,_3U>,
                       &angMom.super_Vector<double,_3U>);
            dVar9 = this->dt2_;
            OpenMD::operator+(&angMom.super_Vector<double,_3U>,&frc.super_Vector<double,_3U>,
                              &omegaBody.super_Vector<double,_3U>);
            operator*((Vector<double,_3U> *)&local_3b8,(dVar9 / dVar8) * 0.0004184,
                      &angMom.super_Vector<double,_3U>);
            OpenMD::operator+((Vector<double,_3U> *)&molPos,&randomForceLab.super_Vector<double,_3U>
                              ,(Vector<double,_3U> *)&local_3b8);
            Vector3<double>::operator=(&randomTorqueLab,(Vector<double,_3U> *)&molPos);
            dVar9 = dot<double,3u>(&omegaBody.super_Vector<double,_3U>,&vel.super_Vector<double,_3U>
                                  );
            dVar10 = Vector<double,_3U>::lengthSquare(&omegaBody.super_Vector<double,_3U>);
          } while (this->forceTolerance_ < ABS(1.0 - dVar9 / dVar10));
          StuntDouble::addFrc(this_01,&omegaBody);
          uVar6 = local_3c0;
          this_00 = local_3c8;
        }
      }
      index = index + 1;
      local_3e8 = local_3e8 + 1;
      this_01 = (StuntDouble *)0x0;
      if (local_3e8 !=
          (this_00->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_00204a79:
        this_01 = *local_3e8;
      }
    }
    this_00 = SimInfo::nextMolecule((this->super_ForceModifier).info_,&i);
  } while( true );
}

Assistant:

void LDForceModifier::modifyForces() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    RealType mass;
    Vector3d pos;
    Vector3d frc;
    Mat3x3d A;
    Mat3x3d Atrans;
    Vector3d Tb;
    Vector3d ji;
    unsigned int index = 0;
    bool doLangevinForces;
    bool freezeMolecule;
    int fdf;

    fdf = 0;

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      doLangevinForces = true;
      freezeMolecule   = false;

      if (sphericalBoundaryConditions_) {
        Vector3d molPos = mol->getCom();
        RealType molRad = molPos.length();

        doLangevinForces = false;

        if (molRad > langevinBufferRadius_) {
          doLangevinForces = true;
          freezeMolecule   = false;
        }
        if (molRad > frozenBufferRadius_) {
          doLangevinForces = false;
          freezeMolecule   = true;
        }
      }

      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        if (freezeMolecule) fdf += sd->freeze();

        if (doLangevinForces) {
          mass = sd->getMass();
          if (sd->isDirectional()) {
            // preliminaries for directional objects:

            A      = sd->getA();
            Atrans = A.transpose();

            Vector3d rcrLab = Atrans * moments_[index]->rcr;

            // apply random force and torque at center of resistance

            Vector3d randomForceBody;
            Vector3d randomTorqueBody;
            genRandomForceAndTorque(randomForceBody, randomTorqueBody, index);
            Vector3d randomForceLab  = Atrans * randomForceBody;
            Vector3d randomTorqueLab = Atrans * randomTorqueBody;

            sd->addFrc(randomForceLab);
            sd->addTrq(randomTorqueLab + cross(rcrLab, randomForceLab));

            Vector3d omegaBody;

            // What remains contains velocity explicitly, but the
            // velocity required is at the full step: v(t + h), while
            // we have initially the velocity at the half step: v(t + h/2).
            // We need to iterate to converge the friction
            // force and friction torque vectors.

            // this is the velocity at the half-step:

            Vector3d vel    = sd->getVel();
            Vector3d angMom = sd->getJ();

            // estimate velocity at full-step using everything but
            // friction forces:

            frc = sd->getFrc();

            Vector3d velStep =
                vel + (dt2_ / mass * Constants::energyConvert) * frc;

            Tb = sd->lab2Body(sd->getTrq());
            Vector3d angMomStep =
                angMom + (dt2_ * Constants::energyConvert) * Tb;

            Vector3d omegaLab;
            Vector3d vcdLab;
            Vector3d vcdBody;
            Vector3d frictionForceBody;
            Vector3d frictionForceLab(0.0);
            Vector3d oldFFL;  // used to test for convergence
            Vector3d frictionTorqueBody(0.0);
            Vector3d oldFTB;  // used to test for convergence
            Vector3d frictionTorqueLab;
            RealType fdot;
            RealType tdot;

            // iteration starts here:

            for (int k = 0; k < maxIterNum_; k++) {
              if (sd->isLinear()) {
                int linearAxis = sd->linearAxis();
                int l          = (linearAxis + 1) % 3;
                int m          = (linearAxis + 2) % 3;
                omegaBody[l]   = angMomStep[l] / moments_[index]->Icr(l, l);
                omegaBody[m]   = angMomStep[m] / moments_[index]->Icr(m, m);

              } else {
                omegaBody = moments_[index]->IcrInv * angMomStep;
                // omegaBody[0] = angMomStep[0] /I(0, 0);
                // omegaBody[1] = angMomStep[1] /I(1, 1);
                // omegaBody[2] = angMomStep[2] /I(2, 2);
              }

              omegaLab = Atrans * omegaBody;

              // apply friction force and torque at center of resistance

              vcdLab             = velStep + cross(omegaLab, rcrLab);
              vcdBody            = A * vcdLab;
              frictionForceBody  = -(hydroProps_[index]->getXitt() * vcdBody +
                                    hydroProps_[index]->getXirt() * omegaBody);
              oldFFL             = frictionForceLab;
              frictionForceLab   = Atrans * frictionForceBody;
              oldFTB             = frictionTorqueBody;
              frictionTorqueBody = -(hydroProps_[index]->getXitr() * vcdBody +
                                     hydroProps_[index]->getXirr() * omegaBody);
              frictionTorqueLab  = Atrans * frictionTorqueBody;

              // re-estimate velocities at full-step using friction forces:

              velStep = vel + (dt2_ / mass * Constants::energyConvert) *
                                  (frc + frictionForceLab);
              angMomStep = angMom + (dt2_ * Constants::energyConvert) *
                                        (Tb + frictionTorqueBody);

              // check for convergence (if the vectors have converged, fdot and
              // tdot will both be 1.0):

              fdot = dot(frictionForceLab, oldFFL) /
                     frictionForceLab.lengthSquare();
              tdot = dot(frictionTorqueBody, oldFTB) /
                     frictionTorqueBody.lengthSquare();

              if (fabs(1.0 - fdot) <= forceTolerance_ &&
                  fabs(1.0 - tdot) <= forceTolerance_)
                break;  // iteration ends here
            }

            sd->addFrc(frictionForceLab);
            sd->addTrq(frictionTorqueLab + cross(rcrLab, frictionForceLab));

          } else {
            // spherical atom

            Vector3d systemForce;
            Vector3d randomForce;
            Vector3d randomTorque;
            genRandomForceAndTorque(randomForce, randomTorque, index);
            systemForce = sd->getFrc();
            sd->addFrc(randomForce);

            // What remains contains velocity explicitly, but the
            // velocity required is at the full step: v(t + h), while
            // we have initially the velocity at the half step: v(t + h/2).
            // We need to iterate to converge the friction
            // force vector.

            // this is the velocity at the half-step:

            Vector3d vel = sd->getVel();

            // estimate velocity at full-step using everything but
            // friction forces:

            frc = sd->getFrc();
            Vector3d velStep =
                vel + (dt2_ / mass * Constants::energyConvert) * frc;

            Vector3d frictionForce(0.0);
            Vector3d oldFF;  // used to test for convergence
            RealType fdot;

            // iteration starts here:

            for (int k = 0; k < maxIterNum_; k++) {
              oldFF         = frictionForce;
              frictionForce = -hydroProps_[index]->getXitt() * velStep;

              // re-estimate velocities at full-step using friction forces:

              velStep = vel + (dt2_ / mass * Constants::energyConvert) *
                                  (frc + frictionForce);

              // check for convergence (if the vector has converged,
              // fdot will be 1.0):

              fdot = dot(frictionForce, oldFF) / frictionForce.lengthSquare();

              if (fabs(1.0 - fdot) <= forceTolerance_)
                break;  // iteration ends here
            }

            sd->addFrc(frictionForce);
          }
        }

        ++index;
      }
    }

    info_->setFdf(fdf);
    if (simParams_->getConserveLinearMomentum()) veloMunge_->removeComDrift();
    // Remove angular drift if we are not using periodic boundary conditions.
    if (!simParams_->getUsePeriodicBoundaryConditions() &&
        simParams_->getConserveAngularMomentum())
      veloMunge_->removeAngularDrift();
  }